

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLoaderUVW.h
# Opt level: O0

void __thiscall
chrono::ChLoaderUVWatomic::ComputeQ
          (ChLoaderUVWatomic *this,ChVectorDynamic<> *state_x,ChVectorDynamic<> *state_w)

{
  int iVar1;
  element_type *peVar2;
  shared_ptr<chrono::ChLoadableUVW> *this_00;
  undefined1 local_50 [8];
  double detJ;
  int local_34;
  undefined1 local_30 [8];
  ChVectorDynamic<> mF;
  ChVectorDynamic<> *state_w_local;
  ChVectorDynamic<> *state_x_local;
  ChLoaderUVWatomic *this_local;
  
  this_00 = &(this->super_ChLoaderUVW).loadable;
  mF.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows =
       (Index)state_w;
  peVar2 = std::__shared_ptr_access<chrono::ChLoadableUVW,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<chrono::ChLoadableUVW,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)this_00);
  iVar1 = (**(code **)(*(long *)(peVar2 + *(long *)(*(long *)peVar2 + -0x78)) + 0x18))
                    (peVar2 + *(long *)(*(long *)peVar2 + -0x78));
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::setZero
            (&(this->super_ChLoaderUVW).super_ChLoader.Q.
              super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,(long)iVar1);
  peVar2 = std::__shared_ptr_access<chrono::ChLoadableUVW,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<chrono::ChLoadableUVW,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)this_00);
  local_34 = (**(code **)(*(long *)(peVar2 + *(long *)(*(long *)peVar2 + -0x78)) + 0x38))
                       (peVar2 + *(long *)(*(long *)peVar2 + -0x78));
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix<int>
            ((Matrix<double,__1,_1,_0,__1,_1> *)local_30,&local_34);
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::setZero
            ((DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)local_30);
  (*(this->super_ChLoaderUVW).super_ChLoader._vptr_ChLoader[5])
            (this->Pu,this->Pv,this->Pw,this,local_30,state_x,
             mF.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows);
  peVar2 = std::__shared_ptr_access<chrono::ChLoadableUVW,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<chrono::ChLoadableUVW,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&(this->super_ChLoaderUVW).loadable);
  (**(code **)(*(long *)peVar2 + 0x68))
            (this->Pu,this->Pv,this->Pw,peVar2,&(this->super_ChLoaderUVW).super_ChLoader.Q,local_50,
             local_30,state_x,
             mF.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix((Matrix<double,__1,_1,_0,__1,_1> *)local_30);
  return;
}

Assistant:

virtual void ComputeQ(ChVectorDynamic<>* state_x,  ///< if != 0, update state (pos. part) to this, then evaluate Q
                          ChVectorDynamic<>* state_w   ///< if != 0, update state (speed part) to this, then evaluate Q
                          ) override {
        Q.setZero(loadable->LoadableGet_ndof_w());
        ChVectorDynamic<> mF(loadable->Get_field_ncoords());
        mF.setZero();

        // Compute F=F(u,v,w)
        this->ComputeF(Pu, Pv, Pw, mF, state_x, state_w);

        // Compute N(u,v,w)'*F
        double detJ;
        loadable->ComputeNF(Pu, Pv, Pw, Q, detJ, mF, state_x, state_w);
    }